

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forwardDilation
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,conv_func conv,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Allocator *_elemsize;
  Allocator *pAVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar16;
  undefined8 uVar23;
  Mat *pMVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  _func_int *p_Var34;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  undefined4 *puVar41;
  ulong uVar42;
  void *pvVar43;
  ulong uVar44;
  int _w;
  ulong uVar45;
  _func_int **pp_Var46;
  int iVar47;
  long lVar48;
  undefined4 *puVar49;
  long lVar50;
  int iVar51;
  void *pvVar52;
  undefined4 *puVar53;
  int iVar54;
  uint uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  Option opt_b;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  ulong uStack_1d0;
  Mat local_1c8;
  Mat local_188;
  ulong local_140;
  long local_138;
  long local_130;
  ulong local_128;
  Option *local_120;
  ulong local_118;
  int local_110;
  int local_10c;
  long local_108;
  long local_100;
  Mat *local_f8;
  Mat *local_f0;
  Option opt_g;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined3 uVar12;
  undefined1 uVar13;
  undefined2 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined3 uVar19;
  undefined1 uVar20;
  undefined2 uVar21;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined3 uVar26;
  undefined1 uVar27;
  undefined2 uVar28;
  undefined1 uVar29;
  
  local_1c8.w = bottom_blob->w;
  local_1c8.h = bottom_blob->h;
  _elemsize = (Allocator *)bottom_blob->elemsize;
  pp_Var46 = this->_vptr_Convolution_x86;
  p_Var34 = pp_Var46[-3];
  uVar55 = *(uint *)(p_Var34 + 0x2c + (long)&(this->weight_sgemm_data).data);
  local_118 = (ulong)uVar55;
  uVar38 = *(uint *)(p_Var34 + 0x34 + (long)&(this->weight_sgemm_data).data);
  iVar1 = *(int *)(p_Var34 + 0x3c + (long)&(this->weight_sgemm_data).data);
  local_1c8.data = bottom_blob->data;
  local_1c8.refcount = bottom_blob->refcount;
  local_1c8.elempack = bottom_blob->elempack;
  local_1c8.allocator = bottom_blob->allocator;
  local_1c8.dims = bottom_blob->dims;
  local_1c8.c = bottom_blob->c;
  local_1c8.cstep = bottom_blob->cstep;
  if (local_1c8.refcount != (int *)0x0) {
    LOCK();
    *local_1c8.refcount = *local_1c8.refcount + 1;
    UNLOCK();
    pp_Var46 = this->_vptr_Convolution_x86;
    p_Var34 = pp_Var46[-3];
  }
  iVar54 = (uVar55 - 1) * uVar38;
  iVar37 = *(int *)(p_Var34 + 4 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  local_1c8.elemsize = (size_t)_elemsize;
  local_f8 = top_blob;
  if ((((iVar37 < 1) &&
       (iVar47 = *(int *)(p_Var34 + 8 +
                         (long)&(this->weight_3x3_winograd43_data).
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
       iVar47 < 1)) &&
      (iVar2 = *(int *)(p_Var34 + 0xc +
                       (long)&(this->weight_3x3_winograd43_data).
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>), iVar2 < 1)
      ) && (iVar3 = *(int *)(p_Var34 + 0x10 +
                            (long)&(this->weight_3x3_winograd43_data).
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
           iVar3 < 1)) {
    if (((iVar37 == -0xe9) && (iVar47 == -0xe9)) && ((iVar2 == -0xe9 && (iVar3 == -0xe9)))) {
      iVar47 = iVar54 - (local_1c8.w + -1) % iVar1;
      iVar37 = iVar54 - (local_1c8.h + -1) % iVar1;
      if ((0 < iVar47) || (0 < iVar37)) {
        opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_b.use_packing_layout = opt->use_packing_layout;
        opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_b.lightmode = opt->lightmode;
        opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_b.num_threads = opt->num_threads;
        opt_b.workspace_allocator = opt->workspace_allocator;
        uVar16._0_1_ = opt->use_winograd_convolution;
        uVar16._1_1_ = opt->use_sgemm_convolution;
        uVar16._2_1_ = opt->use_int8_inference;
        uVar16._3_1_ = opt->use_vulkan_compute;
        uVar17 = opt->use_fp16_packed;
        uVar18 = opt->use_fp16_storage;
        uVar20 = opt->use_fp16_arithmetic;
        uVar22 = opt->use_int8_storage;
        uVar21 = CONCAT11(uVar22,uVar20);
        uVar19 = CONCAT21(uVar21,uVar18);
        uVar16._4_4_ = CONCAT31(uVar19,uVar17);
        opt_b._24_4_ = SUB84(uVar16,0);
        opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_b._28_4_ = uVar16._4_4_;
        copy_make_border(bottom_blob,&local_1c8,iVar37 / 2,iVar37 - iVar37 / 2,iVar47 / 2,
                         iVar47 - iVar47 / 2,0,
                         *(float *)(pp_Var46[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,&opt_b);
        goto LAB_001272d8;
      }
    }
    else if ((((iVar37 == -0xea) && (iVar47 == -0xea)) && (iVar2 == -0xea)) && (iVar3 == -0xea)) {
      iVar47 = iVar54 - (local_1c8.w + -1) % iVar1;
      iVar37 = iVar54 - (local_1c8.h + -1) % iVar1;
      if ((0 < iVar47) || (0 < iVar37)) {
        opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_b.use_packing_layout = opt->use_packing_layout;
        opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
        opt_b.lightmode = opt->lightmode;
        opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_b.num_threads = opt->num_threads;
        opt_b.workspace_allocator = opt->workspace_allocator;
        uVar23._0_1_ = opt->use_winograd_convolution;
        uVar23._1_1_ = opt->use_sgemm_convolution;
        uVar23._2_1_ = opt->use_int8_inference;
        uVar23._3_1_ = opt->use_vulkan_compute;
        uVar24 = opt->use_fp16_packed;
        uVar25 = opt->use_fp16_storage;
        uVar27 = opt->use_fp16_arithmetic;
        uVar29 = opt->use_int8_storage;
        uVar28 = CONCAT11(uVar29,uVar27);
        uVar26 = CONCAT21(uVar28,uVar25);
        uVar23._4_4_ = CONCAT31(uVar26,uVar24);
        opt_b._24_4_ = SUB84(uVar23,0);
        opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_b._28_4_ = uVar23._4_4_;
        copy_make_border(bottom_blob,&local_1c8,iVar37 - iVar37 / 2,iVar37 / 2,iVar47 - iVar47 / 2,
                         iVar47 / 2,0,
                         *(float *)(pp_Var46[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,&opt_b);
        goto LAB_001272d8;
      }
    }
  }
  else {
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_b.lightmode = opt->lightmode;
    opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    uVar9._0_1_ = opt->use_winograd_convolution;
    uVar9._1_1_ = opt->use_sgemm_convolution;
    uVar9._2_1_ = opt->use_int8_inference;
    uVar9._3_1_ = opt->use_vulkan_compute;
    uVar10 = opt->use_fp16_packed;
    uVar11 = opt->use_fp16_storage;
    uVar13 = opt->use_fp16_arithmetic;
    uVar15 = opt->use_int8_storage;
    uVar14 = CONCAT11(uVar15,uVar13);
    uVar12 = CONCAT21(uVar14,uVar11);
    uVar9._4_4_ = CONCAT31(uVar12,uVar10);
    opt_b._24_4_ = SUB84(uVar9,0);
    opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var34 = pp_Var46[-3];
    opt_b._28_4_ = uVar9._4_4_;
    copy_make_border(bottom_blob,&local_1c8,
                     *(int *)(p_Var34 + 0xc +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var34 + 0x10 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var34 + 4 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var34 + 8 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),0,
                     *(float *)(p_Var34 + 0x14 +
                               (long)&(this->weight_3x3_winograd43_data).
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     &opt_b);
LAB_001272d8:
    if ((local_1c8.data == (void *)0x0) || ((long)local_1c8.c * local_1c8.cstep == 0)) {
      iVar37 = -100;
      goto LAB_00127bca;
    }
  }
  pMVar30 = local_f8;
  iVar3 = local_1c8.h;
  iVar2 = local_1c8.w;
  iVar47 = (local_1c8.w - (iVar54 + 1)) / iVar1;
  _w = iVar47 + 1;
  local_128 = (ulong)uVar38;
  local_f0 = bottom_blob;
  Mat::create(local_f8,_w,(local_1c8.h - (iVar54 + 1)) / iVar1 + 1,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(this->weight_sgemm_data).data),(size_t)_elemsize,opt->blob_allocator);
  uVar31 = local_128;
  iVar37 = -100;
  opt_b.blob_allocator =
       (Allocator *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
  local_188.refcount = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if ((pMVar30->data != (void *)0x0) &&
     (opt_b.blob_allocator =
           (Allocator *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_),
     local_188.refcount = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_),
     (long)pMVar30->c * pMVar30->cstep != 0)) {
    opt_b.workspace_allocator = (Allocator *)0x0;
    opt_b.use_winograd_convolution = false;
    opt_b.use_sgemm_convolution = false;
    opt_b.use_int8_inference = false;
    opt_b.use_vulkan_compute = false;
    opt_b.lightmode = false;
    opt_b._1_3_ = 0;
    opt_b.num_threads = 0;
    opt_b.blob_allocator = (Allocator *)0x0;
    opt_b.use_int8_arithmetic = false;
    opt_b.use_packing_layout = false;
    opt_b._34_6_ = 0;
    iStack_1e0 = 0;
    iStack_1dc = 0;
    local_1d8 = 0;
    iStack_1d4 = 0;
    uStack_1d0 = 0;
    local_188.elemsize = 0;
    local_188.elempack = 0;
    local_188.data = (void *)0x0;
    local_188.refcount = (int *)0x0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.c = 0;
    local_188.cstep = 0;
    iVar54 = (int)local_128;
    if (iVar54 < 1) {
      iVar37 = 0;
    }
    else {
      local_10c = iVar54 + iVar2 + -1;
      local_110 = iVar54 + -1 + iVar3;
      local_130 = 0;
      local_138 = 0;
      local_140 = 0;
      local_120 = opt;
      opt_b.blob_allocator = (Allocator *)0x0;
      local_188.refcount = (int *)0x0;
      do {
        uVar7 = (long)(local_110 - (int)local_140) / (long)(int)local_128;
        iVar32 = (int)uVar7;
        iVar3 = (iVar32 - (int)local_118) / iVar1;
        uVar55 = iVar3 + 1;
        local_108 = local_130;
        local_100 = local_138;
        uVar44 = 0;
        do {
          uVar36 = (long)(local_10c - (int)uVar44) / (long)(int)local_128;
          iVar33 = (int)uVar36;
          iVar8 = (iVar33 - (int)local_118) / iVar1;
          iVar51 = local_f0->c;
          pAVar4 = local_120->workspace_allocator;
          auVar57._0_4_ = -(uint)(iStack_1e0 == 3);
          auVar57._4_4_ = -(uint)(iVar33 == iStack_1dc);
          auVar57._8_4_ = -(uint)(iVar32 == local_1d8);
          auVar57._12_4_ = -(uint)(iVar51 == iStack_1d4);
          iVar37 = movmskps((int)local_128,auVar57);
          if ((((iVar37 != 0xf) || (opt_b._24_4_ != 1)) || ((Allocator *)opt_b._32_8_ != pAVar4)) ||
             (opt_b.workspace_allocator != _elemsize)) {
            if (opt_b.blob_allocator != (Allocator *)0x0) {
              LOCK();
              *(int *)&(opt_b.blob_allocator)->_vptr_Allocator =
                   *(int *)&(opt_b.blob_allocator)->_vptr_Allocator + -1;
              UNLOCK();
              if (*(int *)&(opt_b.blob_allocator)->_vptr_Allocator == 0) {
                if (opt_b._32_8_ == 0) {
                  if (opt_b._0_8_ != 0) {
                    free((void *)opt_b._0_8_);
                  }
                }
                else {
                  (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                }
              }
            }
            opt_b.lightmode = false;
            opt_b._1_3_ = 0;
            opt_b.num_threads = 0;
            opt_b.blob_allocator._0_4_ = 0;
            opt_b.blob_allocator._4_4_ = 0;
            opt_b.blob_allocator = (Allocator *)0x0;
            opt_b.use_winograd_convolution = true;
            opt_b.use_sgemm_convolution = false;
            opt_b.use_int8_inference = false;
            opt_b.use_vulkan_compute = false;
            iStack_1e0 = 3;
            uStack_1d0 = ((long)(iVar32 * iVar33) * (long)_elemsize + 0xfU & 0xfffffffffffffff0) /
                         (ulong)_elemsize;
            opt_b.workspace_allocator = _elemsize;
            opt_b._32_8_ = pAVar4;
            if ((long)iVar51 * uStack_1d0 != 0) {
              uVar42 = (long)iVar51 * uStack_1d0 * (long)_elemsize + 3 & 0xfffffffffffffffc;
              if (pAVar4 == (Allocator *)0x0) {
                opt_g.lightmode = false;
                opt_g._1_3_ = 0;
                opt_g.num_threads = 0;
                iVar37 = posix_memalign((void **)&opt_g,0x10,uVar42 + 4);
                opt_b._0_8_ = 0;
                if (iVar37 == 0) {
                  opt_b._0_8_ = opt_g._0_8_;
                }
              }
              else {
                iVar37 = (*pAVar4->_vptr_Allocator[2])(pAVar4,uVar42 + 4);
                opt_b._0_8_ = CONCAT44(extraout_var,iVar37);
              }
              opt_b.blob_allocator = (Allocator *)(opt_b._0_8_ + uVar42);
              *(undefined4 *)(opt_b._0_8_ + uVar42) = 1;
              iStack_1dc = iVar33;
              local_1d8 = iVar32;
              iStack_1d4 = iVar51;
              goto LAB_001276fe;
            }
LAB_00127c20:
            iVar37 = -100;
            goto LAB_00127c25;
          }
          if (opt_b._0_8_ == 0) goto LAB_00127c20;
LAB_001276fe:
          iVar37 = -100;
          if ((long)iVar51 * uStack_1d0 == 0) goto LAB_00127c25;
          uVar38 = iVar8 + 1;
          iVar51 = *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                           (long)&(this->weight_sgemm_data).data);
          pAVar4 = local_120->workspace_allocator;
          auVar56._0_4_ = -(uint)(local_188.dims == 3);
          auVar56._4_4_ = -(uint)(uVar38 == local_188.w);
          auVar56._8_4_ = -(uint)(uVar55 == local_188.h);
          auVar56._12_4_ = -(uint)(iVar51 == local_188.c);
          iVar39 = movmskps(uVar38,auVar56);
          if (((iVar39 == 0xf) && (local_188.elempack == 1)) &&
             ((local_188.allocator == pAVar4 && ((Allocator *)local_188.elemsize == _elemsize)))) {
            if (local_188.data == (void *)0x0) goto LAB_00127c25;
          }
          else {
            if (local_188.refcount != (int *)0x0) {
              LOCK();
              *local_188.refcount = *local_188.refcount + -1;
              UNLOCK();
              if (*local_188.refcount == 0) {
                if (local_188.allocator == (Allocator *)0x0) {
                  if (local_188.data != (void *)0x0) {
                    free(local_188.data);
                  }
                }
                else {
                  (*(local_188.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_188.data = (void *)0x0;
            local_188.refcount._0_4_ = 0;
            local_188.refcount._4_4_ = 0;
            local_188.refcount = (int *)0x0;
            local_188.elempack = 1;
            local_188.dims = 3;
            local_188.cstep =
                 ((long)(int)(uVar55 * uVar38) * (long)_elemsize + 0xfU & 0xfffffffffffffff0) /
                 (ulong)_elemsize;
            local_188.elemsize = (size_t)_elemsize;
            local_188.allocator = pAVar4;
            local_188.w = uVar38;
            local_188.h = uVar55;
            local_188.c = iVar51;
            if ((long)iVar51 * local_188.cstep == 0) goto LAB_00127c20;
            uVar42 = (long)iVar51 * local_188.cstep * (long)_elemsize + 3 & 0xfffffffffffffffc;
            if (pAVar4 == (Allocator *)0x0) {
              opt_g.lightmode = false;
              opt_g._1_3_ = 0;
              opt_g.num_threads = 0;
              iVar37 = posix_memalign((void **)&opt_g,0x10,uVar42 + 4);
              local_188.data = (void *)0x0;
              if (iVar37 == 0) {
                local_188.data = (void *)opt_g._0_8_;
              }
            }
            else {
              iVar37 = (*pAVar4->_vptr_Allocator[2])(pAVar4,uVar42 + 4);
              local_188.data = (void *)CONCAT44(extraout_var_00,iVar37);
            }
            local_188.refcount = (int *)((long)local_188.data + uVar42);
            *(undefined4 *)((long)local_188.data + uVar42) = 1;
            iVar51 = local_188.c;
          }
          iVar37 = -100;
          if ((long)iVar51 * local_188.cstep == 0) goto LAB_00127c25;
          iVar37 = local_f0->c;
          if (0 < (long)iVar37) {
            lVar48 = (long)local_1c8.data + local_100;
            lVar50 = 0;
            lVar35 = opt_b._0_8_;
            do {
              if (0 < iVar32) {
                iVar51 = 0;
                uVar42 = 0;
                lVar40 = lVar35;
                do {
                  if (0 < iVar33) {
                    puVar41 = (undefined4 *)(lVar48 + (long)iVar51 * 4);
                    uVar45 = 0;
                    do {
                      *(undefined4 *)(lVar40 + uVar45 * 4) = *puVar41;
                      uVar45 = uVar45 + 1;
                      puVar41 = puVar41 + uVar31;
                    } while ((uVar36 & 0xffffffff) != uVar45);
                  }
                  uVar42 = uVar42 + 1;
                  iVar51 = iVar51 + iVar2 * iVar54;
                  lVar40 = lVar40 + (long)iVar33 * 4;
                } while (uVar42 != (uVar7 & 0xffffffff));
              }
              lVar50 = lVar50 + 1;
              lVar48 = lVar48 + local_1c8.cstep * local_1c8.elemsize;
              lVar35 = lVar35 + uStack_1d0 * (long)opt_b.workspace_allocator;
            } while (lVar50 != iVar37);
          }
          opt_g.lightmode = local_120->lightmode;
          opt_g._1_3_ = *(undefined3 *)&local_120->field_0x1;
          opt_g.num_threads = local_120->num_threads;
          opt_g.workspace_allocator = local_120->workspace_allocator;
          opt_g.use_winograd_convolution = local_120->use_winograd_convolution;
          opt_g.use_sgemm_convolution = local_120->use_sgemm_convolution;
          opt_g.use_int8_inference = local_120->use_int8_inference;
          opt_g.use_vulkan_compute = local_120->use_vulkan_compute;
          opt_g.use_fp16_packed = local_120->use_fp16_packed;
          opt_g.use_fp16_storage = local_120->use_fp16_storage;
          opt_g.use_fp16_arithmetic = local_120->use_fp16_arithmetic;
          opt_g.use_int8_storage = local_120->use_int8_storage;
          opt_g.use_int8_arithmetic = local_120->use_int8_arithmetic;
          opt_g.use_packing_layout = local_120->use_packing_layout;
          opt_g._34_6_ = *(undefined6 *)&local_120->field_0x22;
          opt_g.blob_allocator = local_188.allocator;
          pMVar30 = (Mat *)(&this->field_0x100 + (long)this->_vptr_Convolution_x86[-3]);
          if ((int)local_118 == 7) {
            pMVar30 = &this->weight_sgemm_data;
          }
          (*conv)((Mat *)&opt_b,&local_188,pMVar30,
                  (Mat *)(&this->field_0x140 + (long)this->_vptr_Convolution_x86[-3]),&opt_g);
          pp_Var46 = this->_vptr_Convolution_x86;
          p_Var34 = pp_Var46[-3];
          if (0 < *(int *)(p_Var34 + 0x28 + (long)&(this->weight_sgemm_data).data)) {
            sVar5 = local_f8->cstep;
            puVar41 = (undefined4 *)((long)local_f8->data + local_108);
            sVar6 = local_f8->elemsize;
            lVar35 = 0;
            pvVar43 = local_188.data;
            do {
              if (-1 < iVar3) {
                uVar36 = 0;
                puVar49 = puVar41;
                pvVar52 = pvVar43;
                do {
                  if (-1 < iVar8) {
                    uVar42 = 0;
                    puVar53 = puVar49;
                    do {
                      *puVar53 = *(undefined4 *)((long)pvVar52 + uVar42 * 4);
                      uVar42 = uVar42 + 1;
                      puVar53 = puVar53 + uVar31;
                    } while (uVar38 != uVar42);
                  }
                  uVar36 = uVar36 + 1;
                  puVar49 = puVar49 + _w * iVar54;
                  pvVar52 = (void *)((long)pvVar52 + (long)(int)uVar38 * 4);
                } while (uVar36 != uVar55);
                p_Var34 = pp_Var46[-3];
              }
              lVar35 = lVar35 + 1;
              puVar41 = (undefined4 *)((long)puVar41 + sVar5 * sVar6);
              pvVar43 = (void *)((long)pvVar43 + local_188.cstep * local_188.elemsize);
            } while (lVar35 < *(int *)(p_Var34 + 0x28 + (long)&(this->weight_sgemm_data).data));
          }
          uVar44 = uVar44 + 1;
          local_100 = local_100 + 4;
          local_108 = local_108 + 4;
        } while (uVar44 != local_128);
        local_140 = local_140 + 1;
        local_138 = local_138 + (long)iVar2 * 4;
        local_130 = local_130 + (long)iVar47 * 4 + 4;
        iVar37 = 0;
      } while (local_140 != local_128);
    }
LAB_00127c25:
    if (local_188.refcount != (int *)0x0) {
      LOCK();
      *local_188.refcount = *local_188.refcount + -1;
      UNLOCK();
      if (*local_188.refcount == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (opt_b.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)&(opt_b.blob_allocator)->_vptr_Allocator =
           *(int *)&(opt_b.blob_allocator)->_vptr_Allocator + -1;
      UNLOCK();
      if (*(int *)&(opt_b.blob_allocator)->_vptr_Allocator == 0) {
        if (opt_b._32_8_ == 0) {
          if (opt_b._0_8_ != 0) {
            free((void *)opt_b._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
        }
      }
    }
  }
LAB_00127bca:
  if (local_1c8.refcount != (int *)0x0) {
    LOCK();
    *local_1c8.refcount = *local_1c8.refcount + -1;
    UNLOCK();
    if (*local_1c8.refcount == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int Convolution_x86::forwardDilation(const Mat& bottom_blob, Mat& top_blob, conv_func conv, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent + (w - 1) / stride * stride - w;
        int hpad = kernel_extent + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x ++)
    {
        for (int y = 0; y < dilation; y ++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c ++)
            {
                float *outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i ++)
                {
                    const float* ptr = (const float *)bottom_blob_bordered.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j ++)
                    {
                        outptr[j] = ptr[j*dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            if (kernel_size == 7)
            {
            // FIXME conv7x7s1_sse use sgemm
            conv(inner_bottom_blob, inner_top_blob, weight_sgemm_data, bias_data, opt_g);
            }
            else
            {
            conv(inner_bottom_blob, inner_top_blob, weight_data, bias_data, opt_g);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c ++)
            {
                float *outptr = (float *)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i ++)
                {
                    const float* ptr = (const float *)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j ++)
                    {
                        outptr[j*dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    return 0;
}